

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void shape_lore_append_list(textblock *tb,char **list,wchar_t n)

{
  char *pcVar1;
  long lVar2;
  
  if (L'\0' < n) {
    textblock_append(tb," %s",*list);
  }
  for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
    pcVar1 = " and";
    if (lVar2 < n + L'\xffffffff') {
      pcVar1 = ",";
    }
    textblock_append(tb,"%s %s",pcVar1,list[lVar2]);
  }
  return;
}

Assistant:

static void shape_lore_append_list(textblock *tb,
	const char * const *list, int n)
{
	int i;

	if (n > 0) {
		textblock_append(tb, " %s", list[0]);
	}
	for (i = 1; i < n; ++i) {
		textblock_append(tb, "%s %s", (i < n - 1) ? "," : " and",
			list[i]);
	}
}